

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::FloatingEqMatcher<double>::Impl<double>::DescribeTo
          (Impl<double> *this,ostream *os)

{
  undefined8 uVar1;
  ostream *poVar2;
  char *pcVar3;
  
  uVar1 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0x11;
  if (((ulong)this->expected_ & 0xfffffffffffff) == 0 ||
      (~(ulong)this->expected_ & 0x7ff0000000000000) != 0) {
    std::operator<<(os,"is approximately ");
    std::ostream::_M_insert<double>(this->expected_);
    if (this->max_abs_error_ < 0.0) goto LAB_0012f4e8;
    std::operator<<(os," (absolute error <= ");
    poVar2 = std::ostream::_M_insert<double>(this->max_abs_error_);
    pcVar3 = ")";
  }
  else {
    poVar2 = os;
    if (this->nan_eq_nan_ == true) {
      pcVar3 = "is NaN";
    }
    else {
      pcVar3 = "never matches";
    }
  }
  std::operator<<(poVar2,pcVar3);
LAB_0012f4e8:
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar1;
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
      // os->precision() returns the previously set precision, which we
      // store to restore the ostream to its original configuration
      // after outputting.
      const ::std::streamsize old_precision = os->precision(
          ::std::numeric_limits<FloatType>::digits10 + 2);
      if (FloatingPoint<FloatType>(expected_).is_nan()) {
        if (nan_eq_nan_) {
          *os << "is NaN";
        } else {
          *os << "never matches";
        }
      } else {
        *os << "is approximately " << expected_;
        if (HasMaxAbsError()) {
          *os << " (absolute error <= " << max_abs_error_ << ")";
        }
      }
      os->precision(old_precision);
    }